

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

double crnlib::image_utils::compute_ssim(image_u8 *a,image_u8 *b,int channel_index)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint8 *puVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint8 uVar18;
  int iVar19;
  int iVar20;
  uint8 *puVar21;
  uint uVar22;
  int iVar23;
  double dVar24;
  double dVar25;
  uint8 sy [36];
  uint8 sx [36];
  uint8 local_88 [48];
  uint8 local_58 [40];
  
  if (a->m_height == 0) {
    uVar10 = 0;
    dVar25 = 0.0;
  }
  else {
    dVar25 = 0.0;
    uVar6 = 0;
    uVar10 = 0;
    do {
      uVar9 = a->m_width;
      if (uVar9 != 0) {
        uVar22 = 0;
        do {
          puVar21 = local_88;
          puVar13 = local_58;
          iVar5 = uVar9 - 1;
          uVar1 = a->m_pitch;
          iVar7 = a->m_height - 1;
          pcVar3 = a->m_pPixels;
          iVar17 = b->m_width - 1;
          iVar14 = b->m_height - 1;
          pcVar4 = b->m_pPixels;
          uVar2 = b->m_pitch;
          lVar12 = 0;
          do {
            iVar8 = 0;
            iVar15 = uVar6 + (int)lVar12;
            iVar19 = iVar14;
            if (iVar15 < iVar14) {
              iVar19 = iVar15;
            }
            if (iVar15 < 0) {
              iVar19 = iVar8;
            }
            iVar20 = iVar14;
            if (iVar15 < iVar14) {
              iVar20 = iVar15;
            }
            if (iVar15 < 0) {
              iVar20 = iVar8;
            }
            iVar23 = iVar7;
            if (iVar15 < iVar7) {
              iVar23 = iVar15;
            }
            if (iVar15 < 0) {
              iVar23 = iVar8;
            }
            iVar11 = iVar7;
            if (iVar15 < iVar7) {
              iVar11 = iVar15;
            }
            if (iVar15 < 0) {
              iVar11 = iVar8;
            }
            lVar16 = 0;
            do {
              iVar15 = uVar22 + (int)lVar16;
              if (channel_index < 0) {
                iVar8 = iVar5;
                if (iVar15 < iVar5) {
                  iVar8 = iVar15;
                }
                if (iVar15 < 0) {
                  iVar8 = 0;
                }
                uVar9 = iVar8 + iVar23 * uVar1;
                uVar18 = (uint8)((uint)pcVar3[uVar9].field_0.field_0.b * 0x1d2f +
                                 (uint)pcVar3[uVar9].field_0.field_0.g * 0x9646 +
                                 (uint)pcVar3[uVar9].field_0.field_0.r * 0x4c8b + 0x8000 >> 0x10);
              }
              else {
                iVar8 = iVar5;
                if (iVar15 < iVar5) {
                  iVar8 = iVar15;
                }
                if (iVar15 < 0) {
                  iVar8 = 0;
                }
                uVar18 = pcVar3[iVar8 + iVar11 * uVar1].field_0.c[(uint)channel_index];
              }
              puVar13[lVar16] = uVar18;
              if (channel_index < 0) {
                iVar8 = iVar15;
                if (iVar17 <= iVar15) {
                  iVar8 = iVar17;
                }
                if (iVar15 < 0) {
                  iVar8 = 0;
                }
                uVar9 = iVar8 + iVar19 * uVar2;
                uVar18 = (uint8)((uint)pcVar4[uVar9].field_0.field_0.b * 0x1d2f +
                                 (uint)pcVar4[uVar9].field_0.field_0.g * 0x9646 +
                                 (uint)pcVar4[uVar9].field_0.field_0.r * 0x4c8b + 0x8000 >> 0x10);
              }
              else {
                iVar8 = iVar15;
                if (iVar17 <= iVar15) {
                  iVar8 = iVar17;
                }
                if (iVar15 < 0) {
                  iVar8 = 0;
                }
                uVar18 = pcVar4[iVar8 + iVar20 * uVar2].field_0.c[(uint)channel_index];
              }
              puVar21[lVar16] = uVar18;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 6);
            lVar12 = lVar12 + 1;
            puVar21 = puVar21 + 6;
            puVar13 = puVar13 + 6;
          } while (lVar12 != 6);
          dVar24 = compute_block_ssim(0x24,local_58,local_88);
          dVar25 = dVar25 + dVar24;
          uVar10 = uVar10 + 1;
          uVar22 = uVar22 + 6;
          uVar9 = a->m_width;
        } while (uVar22 < uVar9);
      }
      uVar6 = uVar6 + 6;
    } while (uVar6 < a->m_height);
  }
  dVar24 = 0.0;
  if (uVar10 != 0) {
    dVar24 = dVar25 / (double)uVar10;
  }
  return dVar24;
}

Assistant:

double compute_ssim(const image_u8& a, const image_u8& b, int channel_index) {
  const uint N = 6;
  uint8 sx[N * N], sy[N * N];

  double total_ssim = 0.0f;
  uint total_blocks = 0;

  //image_u8 yimg((a.get_width() + N - 1) / N, (a.get_height() + N - 1) / N);

  for (uint y = 0; y < a.get_height(); y += N) {
    for (uint x = 0; x < a.get_width(); x += N) {
      for (uint iy = 0; iy < N; iy++) {
        for (uint ix = 0; ix < N; ix++) {
          if (channel_index < 0)
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy).get_luma();
          else
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy)[channel_index];

          if (channel_index < 0)
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy).get_luma();
          else
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy)[channel_index];
        }
      }

      double ssim = compute_block_ssim(N * N, sx, sy);
      total_ssim += ssim;
      total_blocks++;

      //uint ssim_c = (uint)math::clamp<double>(ssim * 127.0f + 128.0f, 0, 255);
      //yimg(x / N, y / N).set(ssim_c, ssim_c, ssim_c, 255);
    }
  }

  if (!total_blocks)
    return 0.0f;

  //save_to_file_stb_or_miniz("ssim.tga", yimg, cWriteFlagGrayscale);

  return total_ssim / total_blocks;
}